

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O0

void cppcms::serialization_traits<mydata,_void>::save
               (serializable_base *real_object,string *serialized_object)

{
  string *in_RSI;
  long *in_RDI;
  archive a;
  string local_78 [48];
  archive local_48 [56];
  string *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  cppcms::archive::archive(local_48);
  (**(code **)(*local_8 + 8))(local_8,local_48);
  cppcms::archive::str_abi_cxx11_();
  std::__cxx11::string::operator=(local_10,local_78);
  std::__cxx11::string::~string(local_78);
  cppcms::archive::~archive(local_48);
  return;
}

Assistant:

static void save(serializable_base const &real_object,std::string &serialized_object)
		{
			archive a;
			real_object.save(a);
			serialized_object = a.str();
		}